

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O1

_Bool al_set_shader_bool(char *name,_Bool b)

{
  ALLEGRO_SHADER *pAVar1;
  _Bool _Var2;
  ALLEGRO_BITMAP *pAVar3;
  
  pAVar3 = al_get_target_bitmap();
  if ((pAVar3 != (ALLEGRO_BITMAP *)0x0) &&
     (pAVar1 = pAVar3->shader, pAVar1 != (ALLEGRO_SHADER *)0x0)) {
    _Var2 = (*pAVar1->vt->set_shader_bool)(pAVar1,name,b);
    return _Var2;
  }
  return false;
}

Assistant:

bool al_set_shader_bool(const char *name, bool b)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_SHADER *shader;

   if ((bmp = al_get_target_bitmap()) != NULL) {
      if ((shader = bmp->shader) != NULL) {
         return shader->vt->set_shader_bool(shader, name, b);
      }
      else {
         return false;
      }
   }
   else {
      return false;
   }
}